

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::CopyPropagateArrays::BuildNewAccessChain
          (CopyPropagateArrays *this,Instruction *insertion_point,MemoryObject *source)

{
  IRContext *this_00;
  pointer pAVar1;
  pointer pAVar2;
  long lVar3;
  uint32_t type_id;
  uint32_t base_ptr_id;
  Instruction *pIVar4;
  long lVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_ids;
  InstructionBuilder builder;
  allocator_type local_79;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  InstructionBuilder local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  local_60.parent_ = IRContext::get_instr_block(this_00,insertion_point);
  local_60.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  if ((source->access_chain_).
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (source->access_chain_).
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pIVar4 = source->variable_inst_;
  }
  else {
    local_60.context_ = this_00;
    local_60.insert_before_.super_iterator.node_ = (iterator)(iterator)insertion_point;
    MemoryObject::BuildConstants(source);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_78,
               (long)(source->access_chain_).
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(source->access_chain_).
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_79);
    pAVar1 = (source->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (source->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pAVar1 != pAVar2) {
      lVar5 = 0;
      do {
        if ((&pAVar1->is_result_id)[lVar5 * 2] == false) {
          __assert_fail("entry.is_result_id && \"Constants needs to be built first.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0xb9,
                        "auto spvtools::opt::CopyPropagateArrays::BuildNewAccessChain(Instruction *, CopyPropagateArrays::MemoryObject *)::(anonymous class)::operator()(const AccessChainEntry &) const"
                       );
        }
        *(undefined4 *)
         ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar5) =
             *(undefined4 *)((long)&pAVar1->field_1 + lVar5 * 2);
        lVar3 = lVar5 * 2;
        lVar5 = lVar5 + 4;
      } while ((pointer)(&pAVar1[1].is_result_id + lVar3) != pAVar2);
    }
    type_id = MemoryObject::GetPointerTypeId(source,this);
    pIVar4 = source->variable_inst_;
    base_ptr_id = 0;
    if (pIVar4->has_result_id_ == true) {
      base_ptr_id = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,&local_78);
    pIVar4 = InstructionBuilder::AddAccessChain(&local_60,type_id,base_ptr_id,&local_40);
    if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return pIVar4;
}

Assistant:

Instruction* CopyPropagateArrays::BuildNewAccessChain(
    Instruction* insertion_point,
    CopyPropagateArrays::MemoryObject* source) const {
  InstructionBuilder builder(
      context(), insertion_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  if (source->AccessChain().size() == 0) {
    return source->GetVariable();
  }

  source->BuildConstants();
  std::vector<uint32_t> access_ids(source->AccessChain().size());
  std::transform(
      source->AccessChain().cbegin(), source->AccessChain().cend(),
      access_ids.begin(), [](const AccessChainEntry& entry) {
        assert(entry.is_result_id && "Constants needs to be built first.");
        return entry.result_id;
      });

  return builder.AddAccessChain(source->GetPointerTypeId(this),
                                source->GetVariable()->result_id(), access_ids);
}